

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFunctionJAOHTree.cpp
# Opt level: O1

void __thiscall QFunctionJAOHTree::Load(QFunctionJAOHTree *this,string *filename)

{
  size_t nrRows;
  long lVar1;
  size_t nrColumns;
  
  if ((this->super_QFunctionJAOH).field_0x38 == '\x01') {
    Initialize(this);
  }
  lVar1 = *(long *)((long)(this->super_QFunctionJAOH).super_QFunctionJAOHInterface + -0x88);
  lVar1 = (**(code **)(*(long *)(&(this->super_QFunctionJAOH).super_QFunctionJAOHInterface.field_0x0
                                + lVar1) + 0x60))
                    (&(this->super_QFunctionJAOH).super_QFunctionJAOHInterface.field_0x0 + lVar1);
  nrRows = *(size_t *)(lVar1 + 0x160);
  lVar1 = *(long *)((long)(this->super_QFunctionJAOH).super_QFunctionJAOHInterface + -0x88);
  lVar1 = (**(code **)(*(long *)(&(this->super_QFunctionJAOH).super_QFunctionJAOHInterface.field_0x0
                                + lVar1) + 0x60))
                    (&(this->super_QFunctionJAOH).super_QFunctionJAOHInterface.field_0x0 + lVar1);
  nrColumns = (**(code **)(**(long **)(lVar1 + 0x30) + 0x68))();
  QTable::Load(filename,nrRows,nrColumns,&(this->super_QFunctionJAOH)._m_QValues);
  return;
}

Assistant:

void QFunctionJAOHTree::Load(const string &filename)
{
    if(_m_initialized)
        Initialize();
#if 0 // don't use this, it makes a copy (so you need twice the memory)

    _m_QValues=MDPSolver::LoadQTable(filename,
                                     GetPU()->
                                     GetNrJointActionObservationHistories(),
                                     GetPU()->GetNrJointActions());
#else
    QTable::Load(filename,
                 GetPU()->GetNrJointActionObservationHistories(),
                 GetPU()->GetNrJointActions(),
                 _m_QValues);
#endif
}